

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

void __thiscall icu_63::RegexMatcher::IncrementTime(RegexMatcher *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  RegexMatcher *this_local;
  
  this->fTickCounter = 10000;
  this->fTime = this->fTime + 1;
  if ((this->fCallbackFn == (URegexMatchCallback *)0x0) ||
     (UVar1 = (*this->fCallbackFn)(this->fCallbackContext,this->fTime), UVar1 != '\0')) {
    if ((0 < this->fTimeLimit) && (this->fTimeLimit <= this->fTime)) {
      *status = U_REGEX_TIME_OUT;
    }
  }
  else {
    *status = U_REGEX_STOPPED_BY_CALLER;
  }
  return;
}

Assistant:

void RegexMatcher::IncrementTime(UErrorCode &status) {
    fTickCounter = TIMER_INITIAL_VALUE;
    fTime++;
    if (fCallbackFn != NULL) {
        if ((*fCallbackFn)(fCallbackContext, fTime) == FALSE) {
            status = U_REGEX_STOPPED_BY_CALLER;
            return;
        }
    }
    if (fTimeLimit > 0 && fTime >= fTimeLimit) {
        status = U_REGEX_TIME_OUT;
    }
}